

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O2

void __thiscall chatra::TemporaryObject::setScopeRef(TemporaryObject *this,Reference targetRef)

{
  pointer pAVar1;
  
  this->type = ScopeRef;
  (this->targetRef).node = targetRef.node;
  this->hasName = false;
  this->hasArgs = false;
  this->hasSetArg = false;
  this->hasVarArgOp = false;
  pAVar1 = (this->args).
           super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->args).super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
      _M_impl.super__Vector_impl_data._M_finish != pAVar1) {
    (this->args).super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
    _M_impl.super__Vector_impl_data._M_finish = pAVar1;
  }
  return;
}

Assistant:

void TemporaryObject::setScopeRef(Reference targetRef) {
	type = Type::ScopeRef;
	this->targetRef = targetRef;
	clearRestrictions();
}